

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer,
              BackwardReferenceFromDecoder *backward_references,size_t back_refs_size,
              BlockSplitFromDecoder *literals_block_splits_decoder,
              BlockSplitFromDecoder *cmds_block_splits_decoder)

{
  size_t *__s;
  int *__s_00;
  uint32_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Command_conflict *p;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined2 uVar9;
  ContextType literal_context_mode;
  uint32_t *buckets_2;
  BrotliEncoderState *s;
  ulong uVar10;
  HasherCommon *pHVar11;
  HasherCommon **ppHVar13;
  ZopfliNode *array;
  uint8_t *puVar14;
  Command_conflict *pCVar15;
  uint8_t *puVar16;
  char cVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  uint8_t *puVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  size_t __n;
  ulong uVar25;
  uint8_t *puVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined8 uVar30;
  uint8_t *puVar31;
  ulong uVar32;
  ulong uVar33;
  uint8_t *puVar34;
  ulong uVar35;
  uint uVar36;
  size_t size;
  ulong uVar37;
  size_t sVar38;
  ulong uVar39;
  long lVar40;
  ulong *puVar41;
  ulong uVar42;
  long lVar43;
  bool bVar44;
  ulong local_7f0;
  ulong *local_7e8;
  uint8_t *local_7e0;
  ulong local_7d8;
  uint8_t *local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  Command_conflict *local_7b8;
  size_t local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  MemoryManager memory_manager;
  ulong local_770;
  size_t num_literals;
  ulong local_760;
  uint8_t *local_758;
  ulong local_750;
  int dist_cache [4];
  ulong local_720;
  uint8_t *local_718;
  size_t local_700;
  size_t last_insert_len;
  size_t available_out;
  uint uStack_6d0;
  undefined8 local_6cc;
  undefined4 uStack_6c4;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  int iStack_6b8;
  int local_6b4;
  undefined8 local_6b0;
  int iStack_6a8;
  int iStack_6a4;
  int local_6a0;
  BrotliDistanceParams local_698;
  BrotliEncoderDictionary local_680;
  int saved_dist_cache [4];
  size_t current_block_cmds;
  size_t current_block_literals;
  uint8_t *next_in;
  BlockSplit local_5b8;
  BlockSplit local_588;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  size_t available_in;
  undefined1 auStack_500 [16];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  int local_4e0;
  int local_4dc;
  undefined1 local_4d8 [40];
  int local_4b0;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  int local_490;
  undefined4 uStack_48c;
  undefined8 uStack_488;
  int local_480 [8];
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined4 local_428;
  undefined8 local_420;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  uint8_t *next_out;
  uint32_t local_74;
  HasherCommon *pHVar12;
  
  uVar2 = *encoded_size;
  if (input_size == 0) {
    if (uVar2 == 0) {
      return 0;
    }
    *encoded_size = 1;
    *encoded_buffer = '\x06';
    goto LAB_001063e4;
  }
  uVar20 = (input_size >> 0xe) * 4 + 6 + input_size;
  uVar27 = 0;
  if (input_size <= uVar20) {
    uVar27 = uVar20;
  }
  if (uVar2 == 0) {
    return 0;
  }
  local_7e8 = encoded_size;
  local_7d0 = (uint8_t *)input_size;
  if (quality != 10) {
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    input_size = (size_t)local_7d0;
    s->backward_references_ = backward_references;
    s->back_refs_size_ = back_refs_size;
    s->literals_block_splits_decoder_ = literals_block_splits_decoder;
    s->cmds_block_splits_decoder_ = cmds_block_splits_decoder;
    available_in = (size_t)local_7d0;
    available_out._0_4_ = (undefined4)*local_7e8;
    available_out._4_4_ = (uint)(*local_7e8 >> 0x20);
    next_out = encoded_buffer;
    memory_manager.alloc_func = (brotli_alloc_func)0x0;
    if (s->is_initialized_ == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = (ulong)local_7d0 & 0xffffffff;
      if (0x18 < lgwin) {
        (s->params).large_window = 1;
      }
    }
    next_in = input_buffer;
    iVar19 = BrotliEncoderCompressStream
                       (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,&available_out,&next_out,
                        (size_t *)&memory_manager);
    puVar41 = local_7e8;
    if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
      iVar19 = 0;
    }
    *local_7e8 = (ulong)memory_manager.alloc_func;
    BrotliEncoderDestroyInstance(s);
    if ((iVar19 != 0) && ((uVar27 == 0 || (*puVar41 <= uVar27)))) goto LAB_001063e4;
    goto LAB_00106302;
  }
  uVar36 = 0x10;
  if (0x10 < lgwin) {
    uVar36 = lgwin;
  }
  uVar24 = 0x1e;
  if ((int)uVar36 < 0x1e) {
    uVar24 = uVar36;
  }
  dist_cache[0] = 4;
  dist_cache[1] = 0xb;
  dist_cache[2] = 0xf;
  dist_cache[3] = 0x10;
  saved_dist_cache[0] = 4;
  saved_dist_cache[1] = 0xb;
  saved_dist_cache[2] = 0xf;
  saved_dist_cache[3] = 0x10;
  current_block_literals = 0;
  current_block_cmds = 0;
  uVar20 = 1L << ((byte)uVar24 & 0x3f);
  if (input_size < uVar20) {
    uVar20 = input_size;
  }
  cVar17 = '\x17';
  if ((int)uVar36 < 0x17) {
    cVar17 = (char)uVar36;
  }
  uVar28 = 1L << (cVar17 + 1U & 0x3f);
  available_in = 0;
  available_out._0_4_ = 0;
  local_6b4 = 0;
  available_out._4_4_ = 0xb;
  uStack_6d0 = 0x16;
  local_6cc = 0;
  uStack_6c4 = 0;
  uStack_6c0 = 0;
  uStack_6bc = 0;
  iStack_6b8 = 0;
  BrotliInitEncoderDictionary(&local_680);
  local_698.distance_postfix_bits = 0;
  local_698.num_direct_distance_codes = 0;
  local_698.alphabet_size_max = 0x40;
  local_698.alphabet_size_limit = 0x40;
  local_698.max_distance = 0x3fffffc;
  uVar36 = uVar24;
  uStack_6d0 = uVar24;
  if (lgwin < 0x19) {
    uVar23 = 0x1e;
    if (local_6b4 == 0) {
      uVar23 = 0x18;
    }
    if (uVar23 < uVar24) {
      uVar36 = 0x18;
      uStack_6d0 = uVar23;
    }
  }
  else {
    local_6b4 = 1;
  }
  available_out._4_4_ = 10;
  if ((uint)local_6cc == 0) {
    uVar23 = 0x10;
    if ((0x10 < uVar36) && (uVar23 = 0x12, uVar36 < 0x12)) {
      uVar23 = uVar36;
    }
  }
  else {
    uVar36 = 0x10;
    if (0x10 < (int)(uint)local_6cc) {
      uVar36 = (uint)local_6cc;
    }
    uVar23 = 0x18;
    if ((int)uVar36 < 0x18) {
      uVar23 = uVar36;
    }
  }
  local_6cc._0_4_ = uVar23;
  ChooseDistanceParams((BrotliEncoderParams *)&available_out);
  uVar10 = 1L << ((byte)local_6cc & 0x3f);
  BrotliInitMemoryManager(&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  if (local_6b4 == 0) {
    if (uVar24 == 0x10) {
      uVar36 = 0;
      local_7c0 = 1;
    }
    else if (uVar24 == 0x11) {
      uVar36 = 1;
      local_7c0 = 7;
    }
    else {
      uVar36 = uVar24 * 2 - 0x21;
      local_7c0 = 4;
    }
  }
  else {
    uVar36 = uVar24 << 8 | 0x11;
    local_7c0 = 0xe;
  }
  if (available_in != 0) {
    if (local_4dc == 0) {
      iVar19 = (int)local_4f0;
      goto LAB_001051e5;
    }
    goto LAB_00105673;
  }
  if ((int)available_out._4_4_ < 10) {
    uVar24 = available_out._4_4_;
    if (available_out._4_4_ == 4) {
      if (0xfffff < CONCAT44(uStack_6bc,uStack_6c0)) {
        local_6b0 = (uint32_t *)CONCAT44(local_6b0._4_4_,0x36);
        uVar24 = 0x36;
        goto LAB_00104d4f;
      }
    }
    else if (4 < (int)available_out._4_4_) {
      if (0x10 < (int)uStack_6d0) {
        iStack_6a8 = available_out._4_4_ - 1;
        if ((uStack_6d0 < 0x13) || (CONCAT44(uStack_6bc,uStack_6c0) < 0x100000)) {
          iVar19 = 0x10;
          if (available_out._4_4_ < 9) {
            iVar19 = 10;
          }
          local_6b0 = (uint32_t *)CONCAT44(0xf - (uint)(available_out._4_4_ < 7),5);
          local_6a0 = 4;
          if (6 < available_out._4_4_) {
            local_6a0 = iVar19;
          }
          uVar24 = 5;
        }
        else {
          local_6b0 = (uint32_t *)0xf00000006;
          iStack_6a4 = 5;
          iVar19 = 0x10;
          if (available_out._4_4_ < 9) {
            iVar19 = 10;
          }
          local_6a0 = 4;
          if (6 < available_out._4_4_) {
            local_6a0 = iVar19;
          }
          uVar24 = 6;
        }
        goto LAB_00104d4f;
      }
      uVar24 = 0x28;
      if (6 < available_out._4_4_) {
        uVar24 = 0x2a - (available_out._4_4_ < 9);
      }
    }
    local_6b0 = (uint32_t *)CONCAT44(local_6b0._4_4_,uVar24);
  }
  else {
    local_6b0 = (uint32_t *)CONCAT44(local_6b0._4_4_,10);
    uVar24 = 10;
  }
LAB_00104d4f:
  pHVar12 = (HasherCommon *)0x0;
  pHVar11 = (HasherCommon *)0x0;
  bVar18 = local_6b0._4_1_;
  if ((int)uStack_6d0 < 0x19) {
    switch(uVar24 - 2) {
    case 0:
    case 1:
      goto switchD_00104d79_caseD_0;
    case 2:
      goto switchD_00104d79_caseD_2;
    case 3:
    case 4:
      goto switchD_00104d79_caseD_3;
    case 5:
    case 6:
    case 7:
      break;
    case 8:
      goto switchD_00104d79_caseD_8;
    default:
      switch(uVar24) {
      case 0x23:
        goto switchD_00104dc4_caseD_23;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        goto switchD_00104d79_caseD_2;
      case 0x2a:
        goto switchD_00104dc4_caseD_2a;
      default:
        if (uVar24 == 0x36) {
          sVar38 = 0x400000;
          goto LAB_00104f19;
        }
      }
    }
    goto switchD_00104d79_caseD_5;
  }
  pHVar11 = pHVar12;
  switch(uVar24 - 2) {
  case 0:
switchD_00104d79_caseD_0:
    sVar38 = 0x40000;
    break;
  case 1:
    local_6b0 = (uint32_t *)CONCAT44(local_6b0._4_4_,0x23);
switchD_00104dc4_caseD_23:
    sVar38 = 0x4040000;
    break;
  case 2:
switchD_00104d79_caseD_2:
    sVar38 = 0x80000;
    break;
  case 3:
switchD_00104d79_caseD_3:
    sVar38 = ((4L << (bVar18 & 0x3f)) << ((byte)iStack_6a8 & 0x3f)) + (2L << (bVar18 & 0x3f));
    goto LAB_00104f10;
  case 4:
    local_6b0 = (uint32_t *)CONCAT44(local_6b0._4_4_,0x41);
    sVar38 = ((4L << (bVar18 & 0x3f)) << ((byte)iStack_6a8 & 0x3f)) + (2L << (bVar18 & 0x3f)) +
             0x4000000;
LAB_00104f10:
    if (sVar38 != 0) break;
    pHVar11 = (HasherCommon *)0x0;
  case 5:
  case 6:
  case 7:
    goto switchD_00104d79_caseD_5;
  case 8:
switchD_00104d79_caseD_8:
    uVar42 = 1L << ((byte)uStack_6d0 & 0x3f);
    if (uVar20 <= uVar42) {
      uVar42 = uVar20;
    }
    sVar38 = uVar42 * 8 + 0x80000;
    break;
  default:
    switch(uVar24) {
    case 0x23:
      goto switchD_00104dc4_caseD_23;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      goto switchD_00104d79_caseD_2;
    case 0x2a:
switchD_00104dc4_caseD_2a:
      sVar38 = 0x140000;
      goto LAB_00104f19;
    default:
      if (uVar24 == 0x36) {
        local_6b0 = (uint32_t *)CONCAT44(local_6b0._4_4_,0x37);
        sVar38 = 0x4400000;
        goto LAB_00104f19;
      }
    }
    goto switchD_00104d79_caseD_5;
  }
LAB_00104f19:
  pHVar11 = (HasherCommon *)BrotliAllocate(&memory_manager,sVar38);
switchD_00104d79_caseD_5:
  sVar38 = CONCAT44(iStack_6a4,iStack_6a8);
  local_4f0 = local_6b0;
  puVar1 = local_4f0;
  local_4e0 = local_6a0;
  local_4f0._0_4_ = (int)local_6b0;
  pHVar12 = (HasherCommon *)local_4d8._16_8_;
  if ((int)local_4f0 < 0x23) {
    local_4f0._4_4_ = (int)((ulong)local_6b0 >> 0x20);
    bVar18 = (byte)((ulong)local_6b0 >> 0x20);
    switch((int)local_4f0) {
    case 2:
    case 3:
    case 4:
switchD_00104fcd_caseD_2:
      local_4d8._0_8_ = &available_in;
      local_4d8._8_8_ = pHVar11;
      break;
    case 5:
      local_4d8._32_8_ = &available_in;
      local_4d8._0_8_ = 1L << (bVar18 & 0x3f);
      local_4d8._8_8_ = 1L << ((byte)iStack_6a8 & 0x3f);
      local_4d8._20_4_ = (int)local_4d8._8_8_ + -1;
      local_4d8._16_4_ = 0x20 - local_4f0._4_4_;
      local_4a8 = (long)&pHVar11->extra + local_4d8._0_8_ * 2;
      local_4d8._24_8_ = CONCAT44(local_6a0,iStack_6a8);
      pHVar12 = (HasherCommon *)local_4d8._16_8_;
      _local_4b0 = pHVar11;
      break;
    case 6:
      local_4a8 = &available_in;
      local_4d8._16_4_ = 0x40 - local_4f0._4_4_;
      uStack_4e8._4_1_ = (char)iStack_6a4;
      local_4d8._24_8_ = 0xffffffffffffffff >> (uStack_4e8._4_1_ * -8 & 0x3fU);
      local_4d8._0_8_ = 1L << (bVar18 & 0x3f);
      local_4d8._8_8_ = 1L << ((byte)iStack_6a8 & 0x3f);
      local_4d8._32_8_ = CONCAT44(iStack_6a8,(int)local_4d8._8_8_ + -1);
      local_4b0 = local_6a0;
      uStack_498 = (long)&pHVar11->extra + local_4d8._0_8_ * 2;
      pHVar12 = (HasherCommon *)local_4d8._16_8_;
      local_4a0 = pHVar11;
      break;
    case 10:
      local_4d8._24_8_ = &pHVar11[0x2aaa].params.block_bits;
      uVar24 = -1 << ((byte)uStack_6d0 & 0x1f);
      local_4d8._0_8_ = ZEXT48(~uVar24);
      local_4d8._16_4_ = uVar24 + 1;
      local_4d8._8_8_ = pHVar11;
      pHVar12 = (HasherCommon *)local_4d8._16_8_;
    }
  }
  else if ((int)local_4f0 < 0x36) {
    switch((int)local_4f0) {
    case 0x23:
switchD_00104f79_caseD_23:
      local_480._24_8_ = &available_in;
      local_480._8_8_ = CONCAT44(local_4dc,local_6a0);
      uStack_498 = auStack_500._0_8_;
      _local_490 = auStack_500._8_8_;
      uStack_488 = local_6b0;
      uStack_460 = 1;
      local_458 = &available_out;
      local_4a0 = pHVar11;
      local_480._0_8_ = sVar38;
      local_480._16_8_ = pHVar11;
      break;
    case 0x28:
    case 0x29:
      local_4d8._24_8_ = &available_in;
      local_4d8._8_8_ =
           (size_t *)
           (ulong)(((int)available_out._4_4_ < 7) + 7 << ((char)available_out._4_4_ - 4U & 0x1f));
      pHVar12 = pHVar11;
      break;
    case 0x2a:
      local_c8 = &available_in;
      local_d8 = ZEXT48(((int)available_out._4_4_ < 7) + 7 <<
                        ((char)available_out._4_4_ - 4U & 0x1f));
      local_d0 = pHVar11;
    }
  }
  else {
    if ((int)local_4f0 == 0x36) goto switchD_00104fcd_caseD_2;
    if ((int)local_4f0 == 0x37) goto switchD_00104f79_caseD_23;
    if ((int)local_4f0 == 0x41) {
      local_430 = &available_in;
      uStack_440 = CONCAT44(local_4dc,local_6a0);
      _uStack_460 = auStack_500._0_8_;
      local_458 = auStack_500._8_8_;
      uStack_450 = local_6b0;
      local_428 = 1;
      local_420 = &available_out;
      local_480._24_8_ = pHVar11;
      local_448 = sVar38;
      local_438 = pHVar11;
    }
  }
  local_4d8._16_8_ = pHVar12;
  local_4dc = 0;
  iVar19 = (int)local_4f0;
  available_in = (size_t)pHVar11;
  local_4f0 = puVar1;
  uStack_4e8 = sVar38;
LAB_001051e5:
  uVar8 = local_d0;
  uVar7 = local_4d8._16_8_;
  uVar30 = local_4d8._8_8_;
  if (iVar19 < 0x23) {
    switch(iVar19) {
    case 2:
      if (uVar20 < 0x801) {
        uVar42 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           ((ulong)(*(long *)(input_buffer + uVar42) * -0x42e1ca5843000000) >> 0x30) * 4) = 0;
          uVar42 = uVar42 + 1;
        } while (uVar20 != uVar42);
      }
      else {
LAB_00105373:
        __n = 0x40000;
LAB_0010564c:
        memset((void *)uVar30,0,__n);
      }
      break;
    case 3:
      if (0x800 < uVar20) goto LAB_00105373;
      uVar42 = 0;
      do {
        lVar40 = *(long *)(input_buffer + uVar42);
        *(uint32_t *)(local_4d8._8_8_ + ((ulong)(lVar40 * -0x42e1ca5843000000) >> 0x30) * 4) = 0;
        *(uint32_t *)
         (local_4d8._8_8_ +
         (ulong)((ushort)((ulong)(lVar40 * -0x42e1ca5843000000) >> 0x30) + 8 & 0xffff) * 4) = 0;
        uVar42 = uVar42 + 1;
      } while (uVar20 != uVar42);
      break;
    case 4:
      if (0x1000 < uVar20) {
        __n = 0x80000;
        goto LAB_0010564c;
      }
      uVar42 = 0;
      do {
        lVar40 = *(long *)(input_buffer + uVar42);
        iVar19 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           (ulong)((uint)((ulong)(lVar40 * -0x42e1ca5843000000) >> 0x2f) + iVar19 & 0x1ffff) * 4) =
               0;
          iVar19 = iVar19 + 8;
        } while (iVar19 != 0x20);
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar20);
      break;
    case 5:
      uVar30 = _local_4b0;
      if ((ulong)local_4d8._0_8_ >> 6 < uVar20) {
LAB_00105427:
        __n = local_4d8._0_8_ * 2;
        goto LAB_0010564c;
      }
      uVar42 = 0;
      do {
        *(uint16_t *)
         (_local_4b0 +
         (ulong)((uint)(*(int *)(input_buffer + uVar42) * 0x1e35a7bd) >>
                ((byte)local_4d8._16_8_ & 0x1f)) * 2) = 0;
        uVar42 = uVar42 + 1;
      } while (uVar20 != uVar42);
      break;
    case 6:
      uVar30 = local_4a0;
      if ((ulong)local_4d8._0_8_ >> 6 < uVar20) goto LAB_00105427;
      uVar42 = 0;
      do {
        *(uint16_t *)
         (local_4a0 +
         ((*(ulong *)(input_buffer + uVar42) & local_4d8._24_8_) * 0x1fe35a7bd3579bd3 >>
          ((byte)local_4d8._16_8_ & 0x3f) & 0xffffffff) * 2) = 0;
        uVar42 = uVar42 + 1;
      } while (uVar20 != uVar42);
      break;
    case 10:
      lVar40 = 0;
      do {
        puVar1 = (uint32_t *)(local_4d8._8_8_ + lVar40 * 4);
        *puVar1 = local_4d8._16_4_;
        puVar1[1] = local_4d8._16_4_;
        puVar1[2] = local_4d8._16_4_;
        puVar1[3] = local_4d8._16_4_;
        lVar40 = lVar40 + 4;
      } while (lVar40 != 0x20000);
    }
    goto switchD_0010520d_caseD_24;
  }
  if (0x35 < iVar19) {
    if (iVar19 == 0x36) {
      if (0x8000 < uVar20) {
        __n = 0x400000;
        goto LAB_0010564c;
      }
      uVar42 = 0;
      do {
        lVar40 = *(long *)(input_buffer + uVar42);
        iVar19 = 0;
        do {
          *(uint32_t *)
           (local_4d8._8_8_ +
           (ulong)((uint)((ulong)(lVar40 * 0x35a7bd1e35a7bd00) >> 0x2c) + iVar19 & 0xfffff) * 4) = 0
          ;
          iVar19 = iVar19 + 8;
        } while (iVar19 != 0x20);
        uVar42 = uVar42 + 1;
      } while (uVar42 != uVar20);
    }
    else if (iVar19 == 0x37) {
      PrepareH55(&((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H55,1,uVar20,input_buffer)
      ;
    }
    else if (iVar19 == 0x41) {
      PrepareH65(&((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H65,1,uVar20,input_buffer)
      ;
    }
    goto switchD_0010520d_caseD_24;
  }
  switch(iVar19) {
  case 0x23:
    PrepareH35(&((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H35,1,uVar20,input_buffer);
    break;
  case 0x28:
    if (uVar20 < 0x201) {
      uVar42 = 0;
      do {
        uVar37 = (ulong)((uint)(*(int *)(input_buffer + uVar42) * 0x1e35a7bd) >> 0x11);
        *(undefined4 *)(local_4d8._16_8_ + uVar37 * 4) = 0xcccccccc;
        *(undefined2 *)(local_4d8._16_8_ + uVar37 * 2 + 0x20000) = 0xcccc;
        uVar42 = uVar42 + 1;
      } while (uVar20 != uVar42);
    }
    else {
LAB_001054f3:
      __s = (size_t *)(local_4d8._16_8_ + 0x20000);
      memset((void *)local_4d8._16_8_,0xcc,0x20000);
      memset(__s,0,0x10000);
    }
    goto LAB_0010551b;
  case 0x29:
    if (0x200 < uVar20) goto LAB_001054f3;
    uVar42 = 0;
    do {
      uVar37 = (ulong)((uint)(*(int *)(input_buffer + uVar42) * 0x1e35a7bd) >> 0x11);
      *(undefined4 *)(local_4d8._16_8_ + uVar37 * 4) = 0xcccccccc;
      *(undefined2 *)(local_4d8._16_8_ + uVar37 * 2 + 0x20000) = 0xcccc;
      uVar42 = uVar42 + 1;
    } while (uVar20 != uVar42);
LAB_0010551b:
    memset((size_t *)(uVar7 + 0x30000),0,0x10000);
    local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffffffff0000;
    break;
  case 0x2a:
    if (uVar20 < 0x201) {
      uVar42 = 0;
      do {
        uVar37 = (ulong)((uint)(*(int *)(input_buffer + uVar42) * 0x1e35a7bd) >> 0x11);
        *(undefined4 *)(local_d0 + uVar37 * 4) = 0xcccccccc;
        *(undefined2 *)(local_d0 + uVar37 * 2 + 0x20000) = 0xcccc;
        uVar42 = uVar42 + 1;
      } while (uVar20 != uVar42);
    }
    else {
      __s_00 = (int *)(local_d0 + 0x20000);
      memset((void *)local_d0,0xcc,0x20000);
      memset(__s_00,0,0x10000);
    }
    memset((HasherCommon *)(uVar8 + 0x30000),0,0x10000);
    memset((anon_union_1048_13_a959428b_for_privat *)local_4d8,0,0x400);
  }
switchD_0010520d_caseD_24:
  auStack_500 = (undefined1  [16])0x0;
  local_4dc = 1;
LAB_00105673:
  if ((int)local_4f0 == 0x41) {
    ppHVar13 = (HasherCommon **)
               ((long)&(((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H35).hb_common +
               0x20);
    if (0x1f < uVar20) {
      lVar40 = 0;
      iVar19 = 0;
      do {
        iVar19 = iVar19 * local_480[3] + (uint)input_buffer[lVar40] + 1;
        lVar40 = lVar40 + 1;
      } while (lVar40 != 0x20);
      local_490 = iVar19;
    }
LAB_0010574b:
    *ppHVar13 = (HasherCommon *)0x0;
  }
  else {
    ppHVar13 = &(((anon_union_1048_13_a959428b_for_privat *)local_4d8)->_H5).common_;
    if ((int)local_4f0 == 0x37) {
      if (0x1f < uVar20) {
        iVar19 = 0;
        uVar20 = 0xfffffffffffffffc;
        do {
          iVar19 = iVar19 * uStack_4ac + (uint)input_buffer[uVar20 + 4] + 1;
          uVar20 = uVar20 + 4;
        } while (uVar20 < 0x1c);
LAB_00105701:
        local_4d8._16_4_ = iVar19;
      }
      goto LAB_0010574b;
    }
    if ((int)local_4f0 == 0x23) {
      if (0x1f < uVar20) {
        iVar19 = 0;
        uVar20 = 0xfffffffffffffffc;
        do {
          iVar19 = iVar19 * uStack_4ac + (uint)input_buffer[uVar20 + 4] + 1;
          uVar20 = uVar20 + 4;
        } while (uVar20 < 0x1c);
        goto LAB_00105701;
      }
      goto LAB_0010574b;
    }
  }
  uVar20 = uVar28 >> 3;
  local_718 = encoded_buffer;
  local_7c8 = 0;
  puVar26 = (uint8_t *)0x0;
  bVar18 = 0;
  local_720 = 0;
  do {
    puVar16 = puVar26 + uVar28;
    if (input_size < puVar26 + uVar28) {
      puVar16 = (uint8_t *)input_size;
    }
    last_insert_len = 0;
    num_literals = 0;
    if (((int)available_out._4_4_ < 10) ||
       (iVar19 = BrotliIsMostlyUTF8(input_buffer,(size_t)puVar26,0x7fffffffffffffff,
                                    (long)puVar16 - (long)puVar26,0.75), iVar19 != 0)) {
      literal_context_mode = CONTEXT_UTF8;
    }
    else {
      literal_context_mode = CONTEXT_SIGNED;
    }
    uVar42 = (ulong)((long)puVar16 - (long)puVar26) / 0xc + 0x10;
    local_700 = 0;
    local_760 = 0;
    local_7b0 = 0;
    pCVar15 = (Command_conflict *)0x0;
    puVar14 = puVar26;
    do {
      uVar37 = (long)puVar16 - (long)puVar14;
      sVar38 = local_7b0;
      if (puVar16 < puVar14 || uVar37 == 0) break;
      if (uVar10 <= uVar37) {
        uVar37 = uVar10;
      }
      sVar38 = uVar37 + 1;
      local_758 = puVar14;
      if (sVar38 == 0) {
        array = (ZopfliNode *)0x0;
      }
      else {
        array = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar38 * 0x10);
      }
      local_7b8 = pCVar15;
      BrotliInitZopfliNodes(array,sVar38);
      if (((uint8_t *)0x7f < local_758) && (2 < uVar37)) {
        puVar14 = local_758 + -0x7f;
        puVar21 = local_758 + (uVar37 - 0x7f);
        if (local_758 < local_758 + (uVar37 - 0x7f)) {
          puVar21 = local_758;
        }
        if (puVar14 < puVar21) {
          do {
            uVar22 = (long)local_758 - (long)puVar14;
            if (uVar22 < 0x10) {
              uVar22 = 0xf;
            }
            uVar23 = (uint)(*(int *)(input_buffer + ((ulong)puVar14 & 0x7fffffffffffffff)) *
                           0x1e35a7bd) >> 0xf;
            uVar24 = *(uint *)(local_4d8._8_8_ + (ulong)uVar23 * 4);
            puVar34 = (uint8_t *)(ulong)uVar24;
            local_7a8 = ((ulong)puVar14 & local_4d8._0_8_) * 2 + 1;
            local_770 = ((ulong)puVar14 & local_4d8._0_8_) * 2;
            *(uint32_t *)(local_4d8._8_8_ + (ulong)uVar23 * 4) = (uint32_t)puVar14;
            if (puVar14 != puVar34) {
              lVar40 = 0x40;
              local_7a0 = 0;
              uVar29 = 0;
LAB_00105a18:
              bVar44 = lVar40 != 0;
              lVar40 = lVar40 + -1;
              if (((ulong)((long)puVar14 - (long)puVar34) <= local_4d8._0_8_ - uVar22) && (bVar44))
              {
                uVar35 = uVar29;
                if (local_7a0 < uVar29) {
                  uVar35 = local_7a0;
                }
                local_7e0 = input_buffer + (long)puVar34;
                puVar31 = local_7e0 + uVar35;
                uVar39 = 0x80 - uVar35;
                if (7 < uVar39) {
                  local_7d8 = CONCAT44(local_7d8._4_4_,uVar24);
                  uVar25 = uVar39 & 0xfffffffffffffff8;
                  lVar43 = 0;
                  uVar32 = 0;
LAB_00105a9e:
                  if (*(ulong *)(puVar31 + uVar32 * 8) ==
                      *(ulong *)(input_buffer +
                                uVar32 * 8 + uVar35 + ((ulong)puVar14 & 0x7fffffffffffffff)))
                  goto code_r0x00105aab;
                  uVar25 = *(ulong *)(input_buffer +
                                     uVar32 * 8 + uVar35 + ((ulong)puVar14 & 0x7fffffffffffffff)) ^
                           *(ulong *)(puVar31 + uVar32 * 8);
                  uVar39 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar32 = (uVar39 >> 3 & 0x1fffffff) - lVar43;
                  goto LAB_00105af8;
                }
                uVar25 = 0;
                goto LAB_00105b6f;
              }
            }
LAB_00105996:
            *(undefined4 *)((long)(void **)local_4d8._24_8_ + local_770 * 4) = local_4d8._16_4_;
            iVar19 = local_4d8._16_4_;
LAB_001059a8:
            *(int *)((long)(void **)local_4d8._24_8_ + local_7a8 * 4) = iVar19;
            puVar14 = puVar14 + 1;
          } while (puVar14 != puVar21);
        }
      }
      sVar38 = BrotliZopfliComputeShortestPath
                         (&memory_manager,uVar37,(size_t)local_758,input_buffer,0x7fffffffffffffff,
                          "" + (literal_context_mode << 9),(BrotliEncoderParams *)&available_out,
                          dist_cache,(Hasher *)&available_in,array);
      uVar22 = local_7b0 + sVar38 + 1;
      if (uVar22 < uVar42) {
        uVar22 = uVar42;
      }
      pCVar15 = local_7b8;
      uVar29 = local_760;
      if ((local_760 != uVar22) &&
         (pCVar15 = (Command_conflict *)BrotliAllocate(&memory_manager,uVar22 << 4), p = local_7b8,
         uVar29 = uVar22, local_7b8 != (Command_conflict *)0x0)) {
        memcpy(pCVar15,local_7b8,local_7b0 << 4);
        BrotliFree(&memory_manager,p);
      }
      local_760 = uVar29;
      puVar14 = local_758;
      local_7d8 = sVar38 + local_7b0;
      BrotliZopfliCreateCommands
                (uVar37,(size_t)local_758,array,dist_cache,&last_insert_len,
                 (BrotliEncoderParams *)&available_out,pCVar15 + local_7b0,&num_literals);
      local_700 = local_700 + uVar37;
      BrotliFree(&memory_manager,array);
      sVar38 = local_7d8;
      if (uVar20 < local_7d8) break;
      puVar14 = puVar14 + uVar37;
      local_7b0 = local_7d8;
    } while (num_literals <= uVar20);
    if (last_insert_len != 0) {
      pCVar15[sVar38].insert_len_ = (uint32_t)last_insert_len;
      pCVar15[sVar38].copy_len_ = 0x8000000;
      pCVar15[sVar38].dist_extra_ = 0;
      pCVar15[sVar38].dist_prefix_ = 0x10;
      if (last_insert_len < 6) {
        uVar42 = last_insert_len & 0xffffffff;
      }
      else if (last_insert_len < 0x82) {
        uVar24 = 0x1f;
        uVar23 = (uint)(last_insert_len - 2);
        if (uVar23 != 0) {
          for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar42 = (ulong)((int)(last_insert_len - 2 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f))
                         + (uVar24 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (last_insert_len < 0x842) {
        uVar23 = (uint32_t)last_insert_len - 0x42;
        uVar24 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar42 = (ulong)((uVar24 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar42 = 0x15;
        if (0x1841 < last_insert_len) {
          uVar42 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
        }
      }
      iVar19 = (int)((uVar42 & 0xffff) >> 3) * 3;
      pCVar15[sVar38].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar19 * 0x40 +
           ((ushort)uVar42 & 7) * 8 + 0x42;
      num_literals = num_literals + last_insert_len;
      sVar38 = sVar38 + 1;
    }
    local_7e0 = puVar26 + local_700;
    local_7f0 = local_7c0;
    uVar9 = (undefined2)uVar36;
    if (local_700 == 0) {
      puVar16 = (uint8_t *)BrotliAllocate(&memory_manager,0x10);
      *(undefined2 *)puVar16 = uVar9;
      *(ulong *)(puVar16 + (local_7f0 >> 3)) =
           3L << ((byte)local_7f0 & 7) | (ulong)puVar16[local_7f0 >> 3];
      local_7f0 = (ulong)((int)local_7f0 + 9U & 0xfffffff8);
    }
    else {
      local_7a0 = (ulong)(local_7e0 == local_7d0);
      iVar19 = ShouldCompress(input_buffer,0x7fffffffffffffff,(uint64_t)puVar26,local_700,
                              num_literals,sVar38);
      if (iVar19 == 0) {
        dist_cache[0] = saved_dist_cache[0];
        dist_cache[1] = saved_dist_cache[1];
        dist_cache[2] = saved_dist_cache[2];
        dist_cache[3] = saved_dist_cache[3];
        puVar16 = (uint8_t *)BrotliAllocate(&memory_manager,local_700 + 0x10);
        *(undefined2 *)puVar16 = uVar9;
        BrotliStoreUncompressedMetaBlock
                  ((int)local_7a0,input_buffer,(size_t)puVar26,0x7fffffffffffffff,local_700,
                   &local_7f0,puVar16);
      }
      else {
        memcpy(&next_out,&available_out,0x90);
        BrotliInitBlockSplit((BlockSplit *)&next_in);
        local_7b8 = pCVar15;
        BrotliInitBlockSplit(&local_5b8);
        BrotliInitBlockSplit(&local_588);
        pCVar15 = local_7b8;
        local_518 = (undefined1  [16])0x0;
        local_528 = (undefined1  [16])0x0;
        local_538 = (undefined1  [16])0x0;
        local_548 = (undefined1  [16])0x0;
        local_558 = (undefined1  [16])0x0;
        local_750 = local_720;
        local_7a8 = CONCAT44(local_7a8._4_4_,(uint)bVar18);
        BrotliBuildMetaBlock
                  (&memory_manager,input_buffer,(size_t)puVar26,0x7fffffffffffffff,
                   (BrotliEncoderParams *)&next_out,bVar18,(uint8_t)local_720,local_7b8,sVar38,
                   literal_context_mode,literals_block_splits_decoder,&current_block_literals,
                   cmds_block_splits_decoder,&current_block_cmds,(MetaBlockSplit *)&next_in);
        BrotliOptimizeHistograms(local_74,(MetaBlockSplit *)&next_in);
        local_7d8 = sVar38;
        puVar16 = (uint8_t *)BrotliAllocate(&memory_manager,local_700 * 2 + 0x1f7);
        *(undefined2 *)puVar16 = uVar9;
        iVar19 = (int)local_7a0;
        BrotliStoreMetaBlock
                  (&memory_manager,input_buffer,(size_t)puVar26,local_700,0x7fffffffffffffff,
                   (uint8_t)local_7a8,(uint8_t)local_750,iVar19,(BrotliEncoderParams *)&next_out,
                   literal_context_mode,pCVar15,local_7d8,(MetaBlockSplit *)&next_in,&local_7f0,
                   puVar16);
        if (local_700 + 4 < local_7f0 >> 3) {
          dist_cache[0] = saved_dist_cache[0];
          dist_cache[1] = saved_dist_cache[1];
          dist_cache[2] = saved_dist_cache[2];
          dist_cache[3] = saved_dist_cache[3];
          *puVar16 = (uint8_t)uVar36;
          puVar16[1] = (uint8_t)(uVar36 >> 8);
          local_7f0 = local_7c0;
          BrotliStoreUncompressedMetaBlock
                    (iVar19,input_buffer,(size_t)puVar26,0x7fffffffffffffff,local_700,&local_7f0,
                     puVar16);
        }
        BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&next_in);
        BrotliDestroyBlockSplit(&memory_manager,&local_5b8);
        BrotliDestroyBlockSplit(&memory_manager,&local_588);
        BrotliFree(&memory_manager,(void *)local_558._0_8_);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_558._8_8_;
        local_558 = auVar3 << 0x40;
        BrotliFree(&memory_manager,(void *)local_548._0_8_);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_548._8_8_;
        local_548 = auVar4 << 0x40;
        BrotliFree(&memory_manager,(void *)local_538._0_8_);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_538._8_8_;
        local_538 = auVar5 << 0x40;
        BrotliFree(&memory_manager,(void *)local_528._0_8_);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_528._8_8_;
        local_528 = auVar6 << 0x40;
        BrotliFree(&memory_manager,(void *)local_518._0_8_);
        pCVar15 = local_7b8;
      }
    }
    input_size = (size_t)local_7d0;
    local_7c0 = local_7f0;
    uVar42 = local_7f0 >> 3;
    uVar36 = (uint)puVar16[uVar42];
    if (local_7e0 < local_7d0) {
      local_720 = (ulong)(input_buffer + -2)[(long)local_7e0];
      bVar18 = (input_buffer + -1)[(long)local_7e0];
    }
    saved_dist_cache[0] = dist_cache[0];
    saved_dist_cache[1] = dist_cache[1];
    saved_dist_cache[2] = dist_cache[2];
    saved_dist_cache[3] = dist_cache[3];
    local_7c8 = local_7c8 + uVar42;
    if (local_7c8 <= uVar2) {
      memcpy(local_718,puVar16,uVar42);
      local_718 = local_718 + uVar42;
    }
    puVar26 = local_7e0;
    BrotliFree(&memory_manager,puVar16);
    BrotliFree(&memory_manager,pCVar15);
    puVar41 = local_7e8;
  } while ((puVar26 < input_size) && (local_7c0 = (ulong)((uint)local_7c0 & 7), local_7c8 <= uVar2))
  ;
  *local_7e8 = local_7c8;
  if (available_in != 0) {
    BrotliFree(&memory_manager,(void *)available_in);
  }
  if ((uVar2 < local_7c8) || ((iVar19 = 1, uVar27 != 0 && (uVar27 < *puVar41)))) {
LAB_00106302:
    *puVar41 = 0;
    iVar19 = 0;
    if (uVar27 - 1 < uVar2) {
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      puVar26 = (uint8_t *)0x2;
      puVar16 = (uint8_t *)0x0;
      do {
        puVar14 = (uint8_t *)0x1000000;
        if (input_size < (uint8_t *)0x1000000) {
          puVar14 = (uint8_t *)input_size;
        }
        iVar19 = 2 - (uint)(input_size < Elf64_Ehdr_00100000.e_ident_magic_str);
        if (input_size < (uint8_t *)0x10001) {
          iVar19 = 0;
        }
        uVar24 = ((int)puVar14 * 8 + iVar19 * 2) - 8;
        uVar36 = 0x80000 << ((byte)(iVar19 << 2) & 0x1f) | uVar24;
        encoded_buffer[(long)puVar26] = (uint8_t)uVar24;
        (encoded_buffer + 1)[(long)puVar26] = (uint8_t)((uint)((int)puVar14 * 8 + -8) >> 8);
        (encoded_buffer + 2)[(long)puVar26] = (uint8_t)(uVar36 >> 0x10);
        if (input_size < Elf64_Ehdr_00100000.e_ident_magic_str) {
          puVar26 = puVar26 + 3;
        }
        else {
          (encoded_buffer + 3)[(long)puVar26] = (uint8_t)(uVar36 >> 0x18);
          puVar26 = puVar26 + 4;
        }
        memcpy(encoded_buffer + (long)puVar26,input_buffer + (long)puVar16,(size_t)puVar14);
        puVar26 = puVar26 + (long)puVar14;
        puVar16 = puVar16 + (long)puVar14;
        input_size = input_size + -(long)puVar14;
      } while ((uint8_t *)input_size != (uint8_t *)0x0);
      encoded_buffer[(long)puVar26] = '\x03';
      *local_7e8 = (ulong)(puVar26 + 1);
LAB_001063e4:
      iVar19 = 1;
    }
  }
  return iVar19;
code_r0x00105aab:
  uVar32 = uVar32 + 1;
  lVar43 = lVar43 + -8;
  if (uVar39 >> 3 == uVar32) goto code_r0x00105ab7;
  goto LAB_00105a9e;
code_r0x00105ab7:
  puVar31 = puVar31 + -lVar43;
LAB_00105b6f:
  uVar39 = uVar39 & 7;
  uVar32 = uVar25;
  if (uVar39 != 0) {
    uVar33 = uVar25 | uVar39;
    do {
      uVar32 = uVar25;
      if (input_buffer[uVar25 + uVar35 + ((ulong)puVar14 & 0x7fffffffffffffff)] != *puVar31) break;
      puVar31 = puVar31 + 1;
      uVar25 = uVar25 + 1;
      uVar39 = uVar39 - 1;
      uVar32 = uVar33;
    } while (uVar39 != 0);
  }
LAB_00105af8:
  uVar32 = uVar32 + uVar35;
  local_750 = uVar29;
  if (0x7f < uVar32) {
    *(undefined4 *)((long)(void **)local_4d8._24_8_ + local_770 * 4) =
         *(undefined4 *)((void **)local_4d8._24_8_ + ((ulong)puVar34 & local_4d8._0_8_));
    iVar19 = *(int *)((long)(void **)local_4d8._24_8_ + ((ulong)puVar34 & local_4d8._0_8_) * 8 + 4);
    goto LAB_001059a8;
  }
  uVar35 = ((ulong)puVar34 & local_4d8._0_8_) * 2;
  if (local_7e0[uVar32] < input_buffer[uVar32 + ((ulong)puVar14 & 0x7fffffffffffffff)]) {
    *(uint *)((long)(void **)local_4d8._24_8_ + local_770 * 4) = uVar24;
    uVar35 = uVar35 | 1;
    local_7a0 = uVar32;
    local_770 = uVar35;
  }
  else {
    *(uint *)((long)(void **)local_4d8._24_8_ + local_7a8 * 4) = uVar24;
    uVar29 = uVar32;
    local_7a8 = uVar35;
  }
  uVar24 = *(uint *)((long)(void **)local_4d8._24_8_ + uVar35 * 4);
  puVar34 = (uint8_t *)(ulong)uVar24;
  if (puVar14 == puVar34) goto LAB_00105996;
  goto LAB_00105a18;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer,
    const BackwardReferenceFromDecoder* backward_references,
    const size_t back_refs_size,
    const BlockSplitFromDecoder* literals_block_splits_decoder,
    const BlockSplitFromDecoder* cmds_block_splits_decoder) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer,
                                           backward_references, back_refs_size,
                                           literals_block_splits_decoder,
                                           cmds_block_splits_decoder);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  s->backward_references_ = backward_references;
  s->back_refs_size_ = back_refs_size;
  s->literals_block_splits_decoder_ = literals_block_splits_decoder;
  s->cmds_block_splits_decoder_ = cmds_block_splits_decoder;
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}